

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.cpp
# Opt level: O2

InputInfo * __thiscall helics::InterfaceInfo::getInput(InterfaceInfo *this,InterfaceHandle handle)

{
  InputInfo *pIVar1;
  InterfaceHandle local_2c;
  shared_handle local_28;
  
  local_2c.hid = handle.hid;
  gmlc::libguarded::
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::lock(&local_28,&this->inputs);
  pIVar1 = gmlc::containers::
           DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
           ::find(local_28.data,&local_2c);
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_28.m_handle_lock);
  return pIVar1;
}

Assistant:

const InputInfo* InterfaceInfo::getInput(InterfaceHandle handle) const
{
    return inputs.lock()->find(handle);
}